

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O3

SHWBufferLink * __thiscall irr::video::CNullDriver::getBufferLink(CNullDriver *this,IMeshBuffer *mb)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if ((mb != (IMeshBuffer *)0x0) &&
     (iVar1 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x70])(), (char)iVar1 != '\0')) {
    iVar1 = (*mb->_vptr_IMeshBuffer[0x1b])(mb);
    if ((SHWBufferLink *)CONCAT44(extraout_var,iVar1) != (SHWBufferLink *)0x0) {
      return (SHWBufferLink *)CONCAT44(extraout_var,iVar1);
    }
    iVar1 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x6e])(this,mb);
    return (SHWBufferLink *)CONCAT44(extraout_var_00,iVar1);
  }
  return (SHWBufferLink *)0x0;
}

Assistant:

CNullDriver::SHWBufferLink *CNullDriver::getBufferLink(const scene::IMeshBuffer *mb)
{
	if (!mb || !isHardwareBufferRecommend(mb))
		return 0;

	// search for hardware links
	SHWBufferLink *HWBuffer = reinterpret_cast<SHWBufferLink *>(mb->getHWBuffer());
	if (HWBuffer)
		return HWBuffer;

	return createHardwareBuffer(mb); // no hardware links, and mesh wants one, create it
}